

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<long_double>::Print(TPZDohrSubstruct<long_double> *this,ostream *out)

{
  TPZMatrix<long_double> *pTVar1;
  ostream *poVar2;
  TPZAutoPointer<TPZMatrix<long_double>_> local_38;
  
  poVar2 = std::operator<<(out,"++++++++++++++++++++++++++++++++++++");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Coarse Index ");
  poVar2 = ::operator<<(poVar2,&this->fCoarseIndex);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Global Index ");
  poVar2 = ::operator<<(poVar2,&this->fGlobalIndex);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Internal Nodes ");
  poVar2 = ::operator<<(poVar2,&this->fInternalEqs);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"Coarse Nodes ");
  poVar2 = ::operator<<(poVar2,&this->fCoarseNodes);
  std::endl<char,std::char_traits<char>>(poVar2);
  TPZMatrix<long_double>::Print
            (&(this->fC_star).super_TPZMatrix<long_double>,"fC_star",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fKeC_star).super_TPZMatrix<long_double>,"fKeC_star",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fNullPivots).super_TPZMatrix<long_double>,"fNullPivots",out,EFormatted);
  poVar2 = std::operator<<(out,"fNEquations = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fNEquations);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fCoarseNodes ");
  poVar2 = ::operator<<(poVar2,&this->fCoarseNodes);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fCoarseIndex ");
  poVar2 = ::operator<<(poVar2,&this->fCoarseIndex);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fGlobalEqs ");
  poVar2 = ::operator<<(poVar2,&this->fGlobalEqs);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fInternalEqs ");
  poVar2 = ::operator<<(poVar2,&this->fInternalEqs);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(out,"fBoundaryEqs ");
  poVar2 = ::operator<<(poVar2,&this->fBoundaryEqs);
  std::endl<char,std::char_traits<char>>(poVar2);
  TPZMatrix<long_double>::Print
            (&(this->fLocalLoad).super_TPZMatrix<long_double>,"fLocalLoad",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fLocalWeightedResidual).super_TPZMatrix<long_double>,"fLocalWeightedResidual",
             out,EFormatted);
  TPZMatrix<long_double>::Print(&(this->fzi).super_TPZMatrix<long_double>,"fzi",out,EFormatted);
  TPZMatrix<long_double>::Print
            (&(this->fAdjustSolution).super_TPZMatrix<long_double>,"fAdjustSolution",out,EFormatted)
  ;
  TPZMatrix<long_double>::Print
            (&(this->fKCi).super_TPZMatrix<long_double>,"Coarse Matrix",out,EFormatted);
  pTVar1 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])
            (pTVar1,"Stiffness Matrix",out,2);
  local_38.fRef = (this->fInvertedStiffness).super_TPZMatrixSolver<long_double>.fContainer.fRef;
  LOCK();
  ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_38.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  (*((local_38.fRef)->fPointer->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1c])
            ((local_38.fRef)->fPointer,"Matrix Ke",out,2);
  TPZAutoPointer<TPZMatrix<long_double>_>::~TPZAutoPointer(&local_38);
  TPZMatrix<long_double>::Print
            (&(this->fC).super_TPZMatrix<long_double>,"Matrix Ci data structure fC",out,
             EMathematicaInput);
  TPZMatrix<long_double>::Print
            (&(this->fPhiC).super_TPZMatrix<long_double>,"fPhiC = ",out,EMathematicaInput);
  poVar2 = std::operator<<(out,"fWeights = ");
  poVar2 = ::operator<<(poVar2,&(this->fWeights).super_TPZVec<long_double>);
  std::endl<char,std::char_traits<char>>(poVar2);
  TPZMatrix<long_double>::Print
            (&(this->fPhiC_Weighted_Condensed).super_TPZMatrix<long_double>,
             "fPhiC_Weighted_Condensed = ",out,EFormatted);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Print(std::ostream &out) const
{
	out << "++++++++++++++++++++++++++++++++++++" << std::endl;
	out << "Coarse Index " << fCoarseIndex << std::endl;
	out << "Global Index " << fGlobalIndex << std::endl;
	out << "Internal Nodes " << fInternalEqs << std::endl;
	out << "Coarse Nodes " << fCoarseNodes << std::endl;
	//fEigenVectors.Print("Eigen vectors",out);
	fC_star.Print("fC_star",out);
	fKeC_star.Print("fKeC_star", out);
	fNullPivots.Print("fNullPivots", out);
	out << "fNEquations = " << fNEquations << std::endl;
	out << "fCoarseNodes " << fCoarseNodes << std::endl;
	
	out << "fCoarseIndex " << fCoarseIndex << std::endl;
	
	out << "fGlobalEqs " << fGlobalEqs << std::endl;
	out << "fInternalEqs " << fInternalEqs << std::endl;
	out << "fBoundaryEqs " << fBoundaryEqs << std::endl;
	fLocalLoad.Print("fLocalLoad",out);
	fLocalWeightedResidual.Print("fLocalWeightedResidual",out);
	fzi.Print("fzi", out);
	fAdjustSolution.Print("fAdjustSolution", out);
	
	
	fKCi.Print("Coarse Matrix",out);
	fStiffness->Print("Stiffness Matrix",out,EMathematicaInput);
	fInvertedStiffness.Matrix()->Print("Matrix Ke",out,EMathematicaInput);
	fC.Print("Matrix Ci data structure fC",out,EMathematicaInput);
	//fEigenVectors.Print("Eigenvectors",out,EMathematicaInput);
	fPhiC.Print("fPhiC = ",out,EMathematicaInput);
	out << "fWeights = " << fWeights  << endl;
	fPhiC_Weighted_Condensed.Print("fPhiC_Weighted_Condensed = ", out);
}